

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppjit.hpp
# Opt level: O0

void __thiscall
cppjit::kernel<bool,_cppjit::detail::pack<int,_double>_>::kernel
          (kernel<bool,_cppjit::detail::pack<int,_double>_> *this,string *kernel_name)

{
  shared_ptr<cppjit::builder::gcc> local_28;
  string *local_18;
  string *kernel_name_local;
  kernel<bool,_cppjit::detail::pack<int,_double>_> *this_local;
  
  local_18 = kernel_name;
  kernel_name_local = &this->kernel_name;
  std::__cxx11::string::string((string *)this,(string *)kernel_name);
  std::make_shared<cppjit::builder::gcc,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  std::shared_ptr<cppjit::builder::builder>::shared_ptr<cppjit::builder::gcc,void>
            (&this->builder,&local_28);
  std::shared_ptr<cppjit::builder::gcc>::~shared_ptr(&local_28);
  std::function<bool_(int,_double)>::function(&this->kernel_implementation);
  this->verbose = false;
  return;
}

Assistant:

kernel(const std::string &kernel_name)
      : kernel_name(kernel_name),
        builder(std::make_shared<cppjit::builder::gcc>(kernel_name)),
        verbose(false) {}